

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# estring.cpp
# Opt level: O3

Vec3f __thiscall embree::string_to_Vec3f(embree *this,string *str)

{
  char *pcVar1;
  uint *puVar2;
  uint uVar3;
  char *pcVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined4 extraout_XMM0_Db;
  undefined8 uVar8;
  Vec3f VVar9;
  char *local_50 [2];
  char local_40 [16];
  
  pcVar1 = (str->_M_dataplus)._M_p;
  puVar2 = (uint *)__errno_location();
  uVar3 = *puVar2;
  pcVar4 = (char *)(ulong)uVar3;
  *puVar2 = 0;
  fVar5 = strtof(pcVar1,local_50);
  if (local_50[0] == pcVar1) {
    std::__throw_invalid_argument("stof");
LAB_001dbb33:
    std::__throw_out_of_range("stof");
LAB_001dbb3f:
    std::__throw_invalid_argument("stof");
  }
  else {
    if (*puVar2 == 0x22) goto LAB_001dbb33;
    if (*puVar2 == 0) {
      *puVar2 = uVar3;
    }
    std::__cxx11::string::substr((ulong)local_50,(ulong)str);
    std::__cxx11::string::operator=((string *)str,(string *)local_50);
    pcVar4 = local_40;
    if (local_50[0] != pcVar4) {
      operator_delete(local_50[0]);
    }
    pcVar1 = (str->_M_dataplus)._M_p;
    uVar3 = *puVar2;
    *puVar2 = 0;
    fVar6 = strtof(pcVar1,local_50);
    if (local_50[0] == pcVar1) goto LAB_001dbb3f;
    if (*puVar2 != 0x22) {
      if (*puVar2 == 0) {
        *puVar2 = uVar3;
      }
      std::__cxx11::string::substr((ulong)local_50,(ulong)str);
      std::__cxx11::string::operator=((string *)str,(string *)local_50);
      if (local_50[0] != pcVar4) {
        operator_delete(local_50[0]);
      }
      pcVar4 = (str->_M_dataplus)._M_p;
      uVar3 = *puVar2;
      *puVar2 = 0;
      fVar7 = strtof(pcVar4,local_50);
      uVar8 = CONCAT44(extraout_XMM0_Db,fVar7);
      if (local_50[0] != pcVar4) {
        if (*puVar2 != 0) {
          if (*puVar2 != 0x22) goto LAB_001dbaf8;
          uVar8 = std::__throw_out_of_range("stof");
        }
        *puVar2 = uVar3;
LAB_001dbaf8:
        *(float *)this = fVar5;
        *(float *)(this + 4) = fVar6;
        *(int *)(this + 8) = (int)uVar8;
        VVar9.field_0.field_0.z = fVar6;
        VVar9.field_0._0_8_ = uVar8;
        return (Vec3f)VVar9.field_0;
      }
      goto LAB_001dbb57;
    }
  }
  uVar3 = (uint)pcVar4;
  std::__throw_out_of_range("stof");
LAB_001dbb57:
  uVar8 = std::__throw_invalid_argument("stof");
  if (*puVar2 == 0) {
    *puVar2 = uVar3;
  }
  _Unwind_Resume(uVar8);
}

Assistant:

Vec3f string_to_Vec3f ( std::string str )
  {
    size_t next = 0;
    const float x = std::stof(str,&next); str = str.substr(next+1);
    const float y = std::stof(str,&next); str = str.substr(next+1);
    const float z = std::stof(str,&next); 
    return Vec3f(x,y,z);
  }